

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_rules_tria.cc
# Opt level: O3

QuadRule * lf::quad::detail::HardcodedQuadRule<(lf::base::RefElType)3,2>(void)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  QuadRule *in_RDI;
  MatrixXd points;
  VectorXd weights;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_68;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_48;
  VectorXd local_38;
  MatrixXd local_28;
  
  local_68.m_storage.m_data = (double *)0x0;
  local_68.m_storage.m_rows = 0;
  local_68.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_68,2,3);
  local_48.m_storage.m_data = (double *)0x0;
  local_48.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_48,3);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,0,0)
  ;
  *pSVar1 = 0.1666666666666666;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,1,0)
  ;
  *pSVar1 = 0.1666666666666668;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,0,1)
  ;
  *pSVar1 = 0.6666666666666665;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,1,1)
  ;
  *pSVar1 = 0.16666666666666666;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,0,2)
  ;
  *pSVar1 = 0.16666666666666685;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,1,2)
  ;
  *pSVar1 = 0.6666666666666667;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,0);
  *pSVar2 = 0.16666666666666666;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,1);
  *pSVar2 = 0.16666666666666666;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,2);
  *pSVar2 = 0.16666666666666666;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_68.m_storage.m_data;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_68.m_storage.m_rows;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_68.m_storage.m_cols;
  local_68.m_storage.m_data = (double *)0x0;
  local_68.m_storage.m_rows = 0;
  local_68.m_storage.m_cols = 0;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       local_48.m_storage.m_data;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_48.m_storage.m_rows;
  local_48.m_storage.m_data = (double *)0x0;
  local_48.m_storage.m_rows = 0;
  QuadRule::QuadRule(in_RDI,(RefEl)0x3,&local_28,&local_38,2);
  free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_48.m_storage.m_data);
  free(local_68.m_storage.m_data);
  return in_RDI;
}

Assistant:

QuadRule HardcodedQuadRule<base::RefEl::kTria(), 2>() { // NOLINT
  Eigen::MatrixXd points(2, 3);
  Eigen::VectorXd weights(3);

  points(0, 0) = 0.1666666666666666019;
  points(1, 0) = 0.16666666666666679619;
  points(0, 1) = 0.66666666666666651864;
  points(1, 1) = 0.16666666666666665741;
  points(0, 2) = 0.1666666666666668517;
  points(1, 2) = 0.66666666666666674068;

  weights(0) = 0.16666666666666665741;
  weights(1) = 0.16666666666666665741;
  weights(2) = 0.16666666666666665741;

  return QuadRule(base::RefEl::kTria(), std::move(points), std::move(weights), 2);
}